

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

void op_http_conn_read_rate_update(OpusHTTPConn *_conn)

{
  op_time read_time;
  
  if (_conn->read_bytes < 1) {
    return;
  }
  op_http_conn_read_rate_update_cold_1();
  return;
}

Assistant:

static void op_http_conn_read_rate_update(OpusHTTPConn *_conn){
  op_time      read_time;
  opus_int32   read_delta_ms;
  opus_int64   read_delta_bytes;
  opus_int64   read_rate;
  read_delta_bytes=_conn->read_bytes;
  if(read_delta_bytes<=0)return;
  op_time_get(&read_time);
  read_delta_ms=op_time_diff_ms(&read_time,&_conn->read_time);
  read_rate=_conn->read_rate;
  read_delta_ms=OP_MAX(read_delta_ms,1);
  read_rate+=read_delta_bytes*1000/read_delta_ms-read_rate+4>>3;
  *&_conn->read_time=*&read_time;
  _conn->read_bytes=0;
  _conn->read_rate=read_rate;
}